

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzw.cc
# Opt level: O0

int main(int argc,char **argv)

{
  char *filename;
  bool bVar1;
  int iVar2;
  ostream *this;
  FILE *__stream;
  FILE *f;
  void *__buf;
  FILE *__n;
  exception *e;
  size_t len;
  undefined1 local_2808 [7];
  bool done;
  uchar buf [10000];
  Pl_LZWDecoder decode;
  Pl_StdioFile out;
  FILE *outfile;
  FILE *infile;
  char *outfilename;
  char *infilename;
  bool early_code_change;
  char **argv_local;
  int argc_local;
  
  infilename._7_1_ = true;
  if ((argc == 4) && (iVar2 = strcmp(argv[3],"--no-early-code-change"), iVar2 == 0)) {
    infilename._7_1_ = false;
  }
  if (2 < argc) {
    filename = argv[2];
    __stream = (FILE *)QUtil::safe_fopen(argv[1],"rb");
    f = QUtil::safe_fopen(filename,"wb");
    Pl_StdioFile::Pl_StdioFile((Pl_StdioFile *)&decode.last_code,"output",f);
    Pl_LZWDecoder::Pl_LZWDecoder
              ((Pl_LZWDecoder *)(buf + 0x2708),"decode",(Pipeline *)&decode.last_code,
               infilename._7_1_);
    bVar1 = false;
    while (!bVar1) {
      __n = __stream;
      __buf = (void *)fread(local_2808,1,10000,__stream);
      if (__buf == (void *)0x0) {
        bVar1 = true;
      }
      else {
        Pl_LZWDecoder::write((Pl_LZWDecoder *)(buf + 0x2708),(int)local_2808,__buf,(size_t)__n);
      }
    }
    Pl_LZWDecoder::finish((Pl_LZWDecoder *)(buf + 0x2708));
    Pl_LZWDecoder::~Pl_LZWDecoder((Pl_LZWDecoder *)(buf + 0x2708));
    Pl_StdioFile::~Pl_StdioFile((Pl_StdioFile *)&decode.last_code);
    return 0;
  }
  this = std::operator<<((ostream *)&std::cerr,
                         "Usage: lzw infile outfile [ --no-early-code-change ]");
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  exit(2);
}

Assistant:

int
main(int argc, char* argv[])
{
    bool early_code_change = true;
    if ((argc == 4) && (strcmp(argv[3], "--no-early-code-change") == 0)) {
        early_code_change = false;
    }

    if (argc < 3) {
        std::cerr << "Usage: lzw infile outfile [ --no-early-code-change ]" << std::endl;
        exit(2);
    }

    try {
        char* infilename = argv[1];
        char* outfilename = argv[2];

        FILE* infile = QUtil::safe_fopen(infilename, "rb");
        FILE* outfile = QUtil::safe_fopen(outfilename, "wb");

        Pl_StdioFile out("output", outfile);
        Pl_LZWDecoder decode("decode", &out, early_code_change);

        unsigned char buf[10000];
        bool done = false;
        while (!done) {
            size_t len = fread(buf, 1, sizeof(buf), infile);
            if (len <= 0) {
                done = true;
            } else {
                decode.write(buf, len);
            }
        }
        decode.finish();
    } catch (std::exception& e) {
        std::cerr << e.what() << std::endl;
        exit(2);
    }

    return 0;
}